

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::TestTexture::populateCompressedLevels
          (TestTexture *this,CompressedTexFormat format,
          vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
          *decompressedLevels)

{
  int iVar1;
  int iVar2;
  pointer pPVar3;
  deUint8 *dst;
  CompressedTexFormat format_00;
  bool bVar4;
  deUint32 dVar5;
  CompressedTexture *this_00;
  ulong uVar6;
  int byteNdx;
  long lVar7;
  CompressedTexture *compressedLevel;
  CompressedTexFormat local_80;
  TexDecompressionParams local_7c;
  vector<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_> *local_78;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *local_70;
  PixelBufferAccess level;
  Random random;
  
  local_80 = format;
  local_70 = decompressedLevels;
  deRandom_init(&random.m_rnd,0x7b);
  local_78 = &this->m_compressedLevels;
  for (uVar6 = 0;
      pPVar3 = (local_70->
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)(((long)(local_70->
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) / 0x28);
      uVar6 = uVar6 + 1) {
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&level.super_ConstPixelBufferAccess,&pPVar3[uVar6].super_ConstPixelBufferAccess);
    this_00 = (CompressedTexture *)operator_new(0x28);
    format_00 = local_80;
    tcu::CompressedTexture::CompressedTexture
              (this_00,local_80,level.super_ConstPixelBufferAccess.m_size.m_data[0],
               level.super_ConstPixelBufferAccess.m_size.m_data[1],
               level.super_ConstPixelBufferAccess.m_size.m_data[2]);
    dst = (this_00->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start;
    compressedLevel = this_00;
    bVar4 = tcu::isAstcFormat(format_00);
    if (bVar4) {
      iVar1 = *(int *)&(compressedLevel->m_data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
      iVar2 = *(int *)&(compressedLevel->m_data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      dVar5 = deRandom_getUint32(&random.m_rnd);
      tcu::astc::generateRandomValidBlocks
                (dst,(long)((iVar1 - iVar2) / 0x10),format_00,ASTCMODE_LDR,dVar5);
    }
    else if (format_00 != COMPRESSEDTEXFORMAT_ETC1_RGB8) {
      for (lVar7 = 0;
          lVar7 < *(int *)&(compressedLevel->m_data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                  *(int *)&(compressedLevel->m_data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start; lVar7 = lVar7 + 1) {
        dVar5 = deRandom_getUint32(&random.m_rnd);
        dst[lVar7] = (deUint8)dVar5;
      }
    }
    std::vector<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>::push_back
              (local_78,&compressedLevel);
    local_7c.astcMode = ASTCMODE_LDR;
    tcu::CompressedTexture::decompress
              (compressedLevel,(PixelBufferAccess *)&level.super_ConstPixelBufferAccess,&local_7c);
  }
  return;
}

Assistant:

void TestTexture::populateCompressedLevels (tcu::CompressedTexFormat format, const std::vector<tcu::PixelBufferAccess>& decompressedLevels)
{
	// Generate random compressed data and update decompressed data

	de::Random random(123);

	for (size_t levelNdx = 0; levelNdx < decompressedLevels.size(); levelNdx++)
	{
		const tcu::PixelBufferAccess	level				= decompressedLevels[levelNdx];
		tcu::CompressedTexture*			compressedLevel		= new tcu::CompressedTexture(format, level.getWidth(), level.getHeight(), level.getDepth());
		deUint8* const					compressedData		= (deUint8*)compressedLevel->getData();

		if (tcu::isAstcFormat(format))
		{
			// \todo [2016-01-20 pyry] Comparison doesn't currently handle invalid blocks correctly so we use only valid blocks
			tcu::astc::generateRandomValidBlocks(compressedData, compressedLevel->getDataSize()/tcu::astc::BLOCK_SIZE_BYTES,
												 format, tcu::TexDecompressionParams::ASTCMODE_LDR, random.getUint32());
		}
		else
		{
			// Generate random compressed data
			// Random initial values cause assertion during the decompression in case of COMPRESSEDTEXFORMAT_ETC1_RGB8 format
			if (format != tcu::COMPRESSEDTEXFORMAT_ETC1_RGB8)
				for (int byteNdx = 0; byteNdx < compressedLevel->getDataSize(); byteNdx++)
					compressedData[byteNdx] = 0xFF & random.getUint32();
		}

		m_compressedLevels.push_back(compressedLevel);

		// Store decompressed data
		compressedLevel->decompress(level, tcu::TexDecompressionParams(tcu::TexDecompressionParams::ASTCMODE_LDR));
	}
}